

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_artifact(parser *p)

{
  void *pvVar1;
  undefined8 *puVar2;
  angband_constants *paVar3;
  curse *pcVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  void *pvVar7;
  object *poVar8;
  uint16_t uVar9;
  object_kind *poVar10;
  bitflag *pbVar11;
  ulong uVar12;
  long lVar13;
  
  z_info->a_max = 0;
  pvVar7 = parser_priv(p);
  paVar3 = z_info;
  uVar9 = z_info->a_max;
  for (; pvVar7 != (void *)0x0; pvVar7 = *(void **)((long)pvVar7 + 0x18)) {
    uVar9 = uVar9 + 1;
    paVar3->a_max = uVar9;
  }
  a_info = (artifact *)mem_zalloc((ulong)uVar9 * 0x140 + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar12 = (ulong)z_info->a_max;
  pvVar7 = parser_priv(p);
  lVar13 = uVar12 * 0x140 + 0x140;
  while( true ) {
    if (pvVar7 == (void *)0x0) {
      z_info->a_max = z_info->a_max + 1;
      wVar5 = tval_find_idx("none");
      wVar6 = lookup_sval(wVar5,"<unknown item>");
      unknown_item_kind = lookup_kind(wVar5,wVar6);
      wVar6 = lookup_sval(wVar5,"<unknown treasure>");
      unknown_gold_kind = lookup_kind(wVar5,wVar6);
      wVar6 = lookup_sval(wVar5,"<pile>");
      pile_kind = lookup_kind(wVar5,wVar6);
      wVar6 = lookup_sval(wVar5,"<curse object>");
      curse_object_kind = lookup_kind(wVar5,wVar6);
      wVar5 = tval_find_idx("none");
      wVar5 = lookup_sval(wVar5,"<curse object>");
      lVar13 = 0x50;
      for (uVar12 = 1; poVar10 = curse_object_kind, pcVar4 = curses, uVar12 < z_info->curse_max;
          uVar12 = uVar12 + 1) {
        puVar2 = *(undefined8 **)(curses->conflict_flags + lVar13 + -0x28);
        *puVar2 = curse_object_kind;
        *(char *)((long)puVar2 + 0x3d) = (char)wVar5;
        poVar8 = (object *)puVar2[5];
        if (poVar8 == (object *)0x0) {
          poVar8 = object_new();
          *(object **)(*(long *)(pcVar4->conflict_flags + lVar13 + -0x28) + 0x28) = poVar8;
          poVar10 = curse_object_kind;
        }
        poVar8->kind = poVar10;
        *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar13 + -0x28) + 0x28) + 0x3d) =
             (char)wVar5;
        poVar8->notice = poVar8->notice | 2;
        lVar13 = lVar13 + 0x38;
      }
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar12 < 1) break;
    memcpy(a_info[-1].flags + lVar13 + -0x48,pvVar7,0x140);
    *(uint32_t *)((long)a_info + lVar13 + -0x130) = (uint32_t)uVar12;
    pvVar1 = *(void **)((long)pvVar7 + 0x18);
    pbVar11 = a_info->flags + lVar13 + -0x48;
    if (z_info->a_max <= uVar12) {
      pbVar11 = (bitflag *)0x0;
    }
    *(bitflag **)((long)a_info + lVar13 + -0x128) = pbVar11;
    mem_free(pvVar7);
    aup_info[uVar12].aidx = (uint32_t)uVar12;
    uVar12 = uVar12 - 1;
    lVar13 = lVar13 + -0x140;
    pvVar7 = pvVar1;
  }
  __assert_fail("aidx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0xbff,"errr finish_parse_artifact(struct parser *)");
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();
	parser_destroy(p);
	return 0;
}